

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManFromIfLogicCreateLutSpecial
              (Gia_Man_t *pNew,word *pRes,Vec_Int_t *vLeaves,Vec_Int_t *vLeavesTemp,
              Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2,Vec_Int_t *vPacking)

{
  int iVar1;
  int iVar2;
  word wVar3;
  uint uVar4;
  long lVar5;
  word local_38;
  
  wVar3 = If_CutPerformDerive07
                    ((If_Man_t *)0x0,(uint *)pRes,vLeaves->nSize,vLeaves->nSize,(char *)0x0);
  vLeavesTemp->nSize = 0;
  for (lVar5 = 0x10; lVar5 != 0x20; lVar5 = lVar5 + 4) {
    uVar4 = (uint)(wVar3 >> ((byte)lVar5 & 0x3f)) & 7;
    if ((uVar4 != 6) || (vLeaves->nSize != 5)) {
      iVar1 = Vec_IntEntry(vLeaves,uVar4);
      Vec_IntPush(vLeavesTemp,iVar1);
    }
  }
  local_38 = (wVar3 & 0xffff) * 0x1000100010001;
  iVar1 = Gia_ManFromIfLogicCreateLut(pNew,&local_38,vLeavesTemp,vCover,vMapping,vMapping2);
  vLeavesTemp->nSize = 0;
  lVar5 = 0x30;
  do {
    if (lVar5 == 0x40) {
      local_38 = (wVar3 >> 0x20 & 0xffff) * 0x1000100010001;
      iVar2 = Gia_ManFromIfLogicCreateLut(pNew,&local_38,vLeavesTemp,vCover,vMapping,vMapping2);
      Vec_IntPush(vPacking,2);
      iVar1 = Abc_Lit2Var(iVar1);
      Vec_IntPush(vPacking,iVar1);
      iVar1 = Abc_Lit2Var(iVar2);
      Vec_IntPush(vPacking,iVar1);
      Vec_IntAddToEntry(vPacking,0,1);
      return iVar2;
    }
    uVar4 = (uint)(wVar3 >> ((byte)lVar5 & 0x3f)) & 7;
    iVar2 = iVar1;
    if (uVar4 == 7) {
LAB_001f32a2:
      Vec_IntPush(vLeavesTemp,iVar2);
    }
    else if ((uVar4 != 6) || (vLeaves->nSize != 5)) {
      iVar2 = Vec_IntEntry(vLeaves,uVar4);
      goto LAB_001f32a2;
    }
    lVar5 = lVar5 + 4;
  } while( true );
}

Assistant:

int Gia_ManFromIfLogicCreateLutSpecial( Gia_Man_t * pNew, word * pRes, Vec_Int_t * vLeaves, Vec_Int_t * vLeavesTemp, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking )
{
    word z = If_CutPerformDerive07( NULL, (unsigned *)pRes, Vec_IntSize(vLeaves), Vec_IntSize(vLeaves), NULL );
    word Truth;
    int i, iObjLit1, iObjLit2;
    // create first LUT
    Vec_IntClear( vLeavesTemp );
    for ( i = 0; i < 4; i++ )
    {
        int v = (int)((z >> (16+(i<<2))) & 7);
        if ( v == 6 && Vec_IntSize(vLeaves) == 5 )
            continue;
        Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, v) );
    }
    Truth = (z & 0xffff);
    Truth |= (Truth << 16);
    Truth |= (Truth << 32);
    iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, &Truth, vLeavesTemp, vCover, vMapping, vMapping2 );
    // create second LUT
    Vec_IntClear( vLeavesTemp );
    for ( i = 0; i < 4; i++ )
    {
        int v =  (int)((z >> (48+(i<<2))) & 7);
        if ( v == 6 && Vec_IntSize(vLeaves) == 5 )
            continue;
        if ( v == 7 )
            Vec_IntPush( vLeavesTemp, iObjLit1 );
        else
            Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, v) );
    }
    Truth = ((z >> 32) & 0xffff);
    Truth |= (Truth << 16);
    Truth |= (Truth << 32);
    iObjLit2 = Gia_ManFromIfLogicCreateLut( pNew, &Truth, vLeavesTemp, vCover, vMapping, vMapping2 );
    // write packing
    Vec_IntPush( vPacking, 2 );
    Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
    Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit2) );
    Vec_IntAddToEntry( vPacking, 0, 1 );
    return iObjLit2;
}